

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_ptr __thiscall mjs::parser::parse_identifier_name(parser *this,char *func,int line)

{
  int in_ECX;
  undefined4 in_register_00000014;
  wstring local_48;
  char *pcStack_20;
  int line_local;
  char *func_local;
  parser *this_local;
  
  pcStack_20 = (char *)CONCAT44(in_register_00000014,line);
  func_local = func;
  this_local = this;
  get_identifier_name_abi_cxx11_(&local_48,(parser *)func,pcStack_20,in_ECX);
  make_expression<mjs::identifier_expression,std::__cxx11::wstring>
            (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)func
            );
  std::__cxx11::wstring::~wstring((wstring *)&local_48);
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parser::parse_identifier_name(const char* func, int line) {
    return make_expression<identifier_expression>(get_identifier_name(func, line));
}